

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_bytedata.cpp
# Opt level: O2

Serializer * __thiscall cfd::core::Serializer::operator<<(Serializer *this,uint64_t number)

{
  AddDirectNumber(this,number);
  return this;
}

Assistant:

Serializer& Serializer::operator<<(uint64_t number) {
  AddDirectNumber(number);
  return *this;
}